

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O1

bool __thiscall
HighsDomain::ConflictSet::explainBoundChangeConflict
          (ConflictSet *this,LocalDomChg *locdomchg,HighsDomainChange *conflict,HighsInt len)

{
  pointer *ppLVar1;
  pointer pHVar2;
  HighsBoundType HVar3;
  int iVar4;
  pointer pLVar5;
  HighsDomain *pHVar6;
  pointer ppVar7;
  iterator __position;
  bool bVar8;
  bool bVar9;
  HighsDomainChange *pHVar10;
  ulong uVar11;
  int *piVar12;
  long lVar13;
  pointer ppVar14;
  bool bVar15;
  bool bVar16;
  double dVar17;
  HighsDomainChange HVar18;
  HighsBoundType local_50;
  LocalDomChg local_48;
  
  pLVar5 = (this->resolvedDomainChanges).
           super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_finish != pLVar5) {
    (this->resolvedDomainChanges).
    super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ._M_impl.super__Vector_impl_data._M_finish = pLVar5;
  }
  HVar18 = flip(this->localdom,&locdomchg->domchg);
  bVar16 = len < 1;
  if (len < 1) {
    bVar9 = false;
LAB_002a0044:
    return (bool)(bVar9 & bVar16);
  }
  uVar11 = 0;
  bVar9 = false;
LAB_0029fde8:
  if ((bVar9) || (conflict[uVar11].column != HVar18.column)) {
LAB_0029fe27:
    if (conflict[uVar11].boundtype == kLower) {
      bVar15 = (this->globaldom->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[conflict[uVar11].column] <
               conflict[uVar11].boundval;
    }
    else {
      bVar15 = conflict[uVar11].boundval <
               (this->globaldom->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
               _M_impl.super__Vector_impl_data._M_start[conflict[uVar11].column];
    }
    bVar8 = bVar9;
    if (bVar15) {
      pHVar10 = conflict + uVar11;
      pHVar6 = this->localdom;
      iVar4 = pHVar10->column;
      ppVar7 = (pHVar6->prevboundval_).
               super__Vector_base<std::pair<double,_int>,_std::allocator<std::pair<double,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (conflict[uVar11].boundtype == kLower) {
        ppVar14 = (pointer)((pHVar6->col_lower_).super__Vector_base<double,_std::allocator<double>_>
                            ._M_impl.super__Vector_impl_data._M_start + iVar4);
        piVar12 = (pHVar6->colLowerPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + iVar4;
        do {
          local_48.pos = *piVar12;
          lVar13 = (long)local_48.pos;
          if (local_48.pos < locdomchg->pos) {
            if (local_48.pos == -1) goto LAB_002a0044;
            dVar17 = ppVar14->first;
            if ((ppVar7[lVar13].first != dVar17) || (NAN(ppVar7[lVar13].first) || NAN(dVar17)))
            goto LAB_0029ffc1;
          }
          ppVar14 = ppVar7 + lVar13;
          piVar12 = &ppVar7[lVar13].second;
        } while( true );
      }
      ppVar14 = (pointer)((pHVar6->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start + iVar4);
      piVar12 = (pHVar6->colUpperPos_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start + iVar4;
      do {
        local_48.pos = *piVar12;
        lVar13 = (long)local_48.pos;
        if (local_48.pos < locdomchg->pos) {
          if (local_48.pos == -1) goto LAB_002a0044;
          dVar17 = ppVar14->first;
          if ((ppVar7[lVar13].first != dVar17) || (NAN(ppVar7[lVar13].first) || NAN(dVar17)))
          goto LAB_0029ff37;
        }
        ppVar14 = ppVar7 + lVar13;
        piVar12 = &ppVar7[lVar13].second;
      } while( true );
    }
  }
  else {
    HVar3 = conflict[uVar11].boundtype;
    local_50 = HVar18.boundtype;
    if (HVar3 != local_50) goto LAB_0029fe27;
    dVar17 = conflict[uVar11].boundval;
    bVar8 = true;
    if (HVar3 == kLower) {
      if (HVar18.boundval < dVar17) goto LAB_0029fe27;
    }
    else if (dVar17 < HVar18.boundval) goto LAB_0029fe27;
  }
  goto LAB_002a0029;
LAB_0029ffc1:
  if ((local_48.pos == -1) || (dVar17 < pHVar10->boundval)) goto LAB_002a0044;
  dVar17 = ppVar7[lVar13].first;
  while (pHVar10->boundval <= dVar17) {
    local_48.pos = ppVar7[lVar13].second;
    lVar13 = (long)local_48.pos;
    dVar17 = ppVar7[lVar13].first;
  }
LAB_0029ff70:
  pHVar2 = (this->localdom->domchgstack_).
           super__Vector_base<HighsDomainChange,_std::allocator<HighsDomainChange>_>._M_impl.
           super__Vector_impl_data._M_start + local_48.pos;
  local_48.domchg.boundval = pHVar2->boundval;
  local_48.domchg.column = pHVar2->column;
  local_48.domchg.boundtype = pHVar2->boundtype;
  __position._M_current =
       (this->resolvedDomainChanges).
       super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->resolvedDomainChanges).
      super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
    ::_M_realloc_insert<HighsDomain::ConflictSet::LocalDomChg>
              (&this->resolvedDomainChanges,__position,&local_48);
  }
  else {
    ((__position._M_current)->domchg).column = local_48.domchg.column;
    ((__position._M_current)->domchg).boundtype = local_48.domchg.boundtype;
    *(ulong *)__position._M_current = CONCAT44(local_48._4_4_,local_48.pos);
    ((__position._M_current)->domchg).boundval = local_48.domchg.boundval;
    ppLVar1 = &(this->resolvedDomainChanges).
               super__Vector_base<HighsDomain::ConflictSet::LocalDomChg,_std::allocator<HighsDomain::ConflictSet::LocalDomChg>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppLVar1 = *ppLVar1 + 1;
  }
LAB_002a0029:
  bVar9 = bVar8;
  uVar11 = uVar11 + 1;
  bVar16 = (uint)len <= uVar11;
  if (uVar11 == (uint)len) goto LAB_002a0044;
  goto LAB_0029fde8;
LAB_0029ff37:
  if ((local_48.pos == -1) || (pHVar10->boundval < dVar17)) goto LAB_002a0044;
  dVar17 = ppVar7[lVar13].first;
  while (dVar17 <= pHVar10->boundval) {
    local_48.pos = ppVar7[lVar13].second;
    lVar13 = (long)local_48.pos;
    dVar17 = ppVar7[lVar13].first;
  }
  goto LAB_0029ff70;
}

Assistant:

bool HighsDomain::ConflictSet::explainBoundChangeConflict(
    const LocalDomChg& locdomchg, const HighsDomainChange* conflict,
    HighsInt len) {
  resolvedDomainChanges.clear();
  auto domchg = localdom.flip(locdomchg.domchg);
  bool foundDomchg = false;
  for (HighsInt i = 0; i < len; ++i) {
    if (!foundDomchg && conflict[i].column == domchg.column &&
        conflict[i].boundtype == domchg.boundtype) {
      if (conflict[i].boundtype == HighsBoundType::kLower) {
        if (conflict[i].boundval <= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      } else {
        if (conflict[i].boundval >= domchg.boundval) {
          foundDomchg = true;
          continue;
        }
      }
    }
    if (globaldom.isActive(conflict[i])) continue;

    HighsInt pos;
    if (conflict[i].boundtype == HighsBoundType::kLower) {
      double lb =
          localdom.getColLowerPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || lb < conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first >= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    } else {
      double ub =
          localdom.getColUpperPos(conflict[i].column, locdomchg.pos - 1, pos);

      if (pos == -1 || ub > conflict[i].boundval) return false;

      while (localdom.prevboundval_[pos].first <= conflict[i].boundval) {
        pos = localdom.prevboundval_[pos].second;
        // since we checked that the bound value is not active globally and is
        // active for the local domain at pos
        // pos should never become -1
        assert(pos != -1);
      }
    }

    resolvedDomainChanges.push_back(
        LocalDomChg{pos, localdom.domchgstack_[pos]});
  }

  return foundDomchg;
}